

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.hpp
# Opt level: O3

type __thiscall
jsoncons::detail::hex_to_integer<long,char>(detail *this,char *s,size_t length,long *n)

{
  detail *pdVar1;
  int iVar2;
  assertion_error *this_00;
  undefined4 uVar3;
  ulong uVar5;
  byte bVar6;
  detail *pdVar7;
  long lVar8;
  detail dVar9;
  type tVar10;
  string local_40;
  undefined7 uVar4;
  
  if (s == (char *)0x0) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"assertion \'length > 0\' failed at  <> :0","");
    assertion_error::assertion_error(this_00,&local_40);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined8 *)length = 0;
  pdVar1 = this + (long)s;
  dVar9 = *this;
  if (dVar9 == (detail)0x2d) {
    this = this + 1;
    if (1 < (long)s) {
      lVar8 = 0;
      do {
        bVar6 = (char)*this - 0x30;
        uVar4 = (undefined7)((ulong)n >> 8);
        uVar3 = (undefined4)CONCAT71(uVar4,2);
        if ((0x36 < bVar6) || ((0x7e0000007e03ffU >> ((ulong)bVar6 & 0x3f) & 1) == 0))
        goto LAB_0024195d;
        n = (long *)CONCAT71(uVar4,1);
        uVar3 = SUB84(n,0);
        if (lVar8 < -0x800000000000000) goto LAB_0024195d;
        uVar5 = (ulong)((uint)(byte)*this + *(int *)(&DAT_00809070 + (ulong)bVar6 * 8));
        lVar8 = lVar8 * 0x10;
        *(long *)length = lVar8;
        if (lVar8 < (long)(uVar5 + 0x8000000000000000)) goto LAB_0024195d;
        lVar8 = lVar8 - uVar5;
        *(long *)length = lVar8;
        this = this + 1;
      } while (this < pdVar1);
    }
  }
  else if (0 < (long)s) {
    pdVar7 = this + 1;
    lVar8 = 0;
    while( true ) {
      bVar6 = (char)dVar9 - 0x30;
      uVar4 = (undefined7)((ulong)n >> 8);
      uVar3 = (undefined4)CONCAT71(uVar4,2);
      if ((0x36 < bVar6) || ((0x7e0000007e03ffU >> ((ulong)bVar6 & 0x3f) & 1) == 0))
      goto LAB_0024195d;
      n = (long *)CONCAT71(uVar4,1);
      uVar3 = SUB84(n,0);
      if (0x7ffffffffffffff < lVar8) goto LAB_0024195d;
      iVar2 = *(int *)(&DAT_00809070 + (ulong)bVar6 * 8);
      lVar8 = lVar8 * 0x10;
      *(long *)length = lVar8;
      if ((long)((ulong)((uint)(byte)dVar9 + iVar2) ^ 0x7fffffffffffffff) < lVar8) break;
      lVar8 = lVar8 + (ulong)((uint)(byte)dVar9 + iVar2);
      *(long *)length = lVar8;
      if (pdVar1 <= pdVar7) {
        uVar3 = 0;
        this = pdVar7;
        goto LAB_0024195d;
      }
      this = this + 1;
      dVar9 = *pdVar7;
      pdVar7 = pdVar7 + 1;
    }
    this = pdVar7 + -1;
    goto LAB_0024195d;
  }
  uVar3 = 0;
LAB_0024195d:
  tVar10._8_4_ = uVar3;
  tVar10.ptr = (char *)this;
  tVar10._12_4_ = 0;
  return tVar10;
}

Assistant:

typename std::enable_if<ext_traits::integer_limits<T>::is_specialized && ext_traits::integer_limits<T>::is_signed,to_integer_result<T,CharT>>::type
hex_to_integer(const CharT* s, std::size_t length, T& n)
{
    static_assert(ext_traits::integer_limits<T>::is_specialized, "Integer type not specialized");
    JSONCONS_ASSERT(length > 0);

    n = 0;

    const CharT* end = s + length; 
    if (*s == '-')
    {
        static constexpr T min_value = (ext_traits::integer_limits<T>::lowest)();
        static constexpr T min_value_div_16 = min_value / 16;
        ++s;
        for (; s < end; ++s)
        {
            CharT c = *s;
            T x = 0;
            switch (c)
            {
                case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                    x = c - '0';
                    break;
                case 'a':case 'b':case 'c':case 'd':case 'e':case 'f':
                    x = c - ('a' - 10);
                    break;
                case 'A':case 'B':case 'C':case 'D':case 'E':case 'F':
                    x = c - ('A' - 10);
                    break;
                default:
                    return to_integer_result<T,CharT>(s, to_integer_errc::invalid_digit);
            }
            if (n < min_value_div_16)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 16;
            if (n < min_value + x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n -= x;
        }
    }
    else
    {
        static constexpr T max_value = (ext_traits::integer_limits<T>::max)();
        static constexpr T max_value_div_16 = max_value / 16;
        for (; s < end; ++s)
        {
            CharT c = *s;
            T x = 0;
            switch (c)
            {
                case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                    x = c - '0';
                    break;
                case 'a':case 'b':case 'c':case 'd':case 'e':case 'f':
                    x = c - ('a' - 10);
                    break;
                case 'A':case 'B':case 'C':case 'D':case 'E':case 'F':
                    x = c - ('A' - 10);
                    break;
                default:
                    return to_integer_result<T,CharT>(s, to_integer_errc::invalid_digit);
            }
            if (n > max_value_div_16)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 16;
            if (n > max_value - x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }

            n += x;
        }
    }

    return to_integer_result<T,CharT>(s, to_integer_errc());
}